

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O2

TestStatus *
vkt::wsi::anon_unknown_0::querySurfaceSupportTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  InstanceDriver *vki;
  Vector<unsigned_int,_2> *log;
  VkPhysicalDevice physicalDevice;
  TestStatus *pTVar1;
  deUint32 dVar2;
  VkBool32 VVar3;
  qpTestResult qVar4;
  ulong uVar5;
  char *pcVar6;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  NativeObjects native;
  ResultCollector results;
  InstanceHelper instHelper;
  allocator<char> local_435;
  Type local_434;
  ulong local_430;
  TestStatus *local_428;
  Vector<unsigned_int,_2> *local_420;
  ulong local_418;
  _Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_410;
  RefBase<vk::Handle<(vk::HandleType)25>_> local_3f8;
  NativeObjects local_3d8;
  undefined1 local_3b8 [80];
  undefined1 local_368 [8];
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_360;
  VkInstance local_358;
  VkAllocationCallbacks *pVStack_350;
  InstanceHelper local_1e8;
  
  log = (Vector<unsigned_int,_2> *)context->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"",(allocator<char> *)local_368);
  tcu::ResultCollector::ResultCollector
            ((ResultCollector *)local_3b8,(TestLog *)log,(string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  InstanceHelper::InstanceHelper(&local_1e8,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_368 = (undefined1  [8])0x0;
  NativeObjects::NativeObjects
            (&local_3d8,context,&local_1e8.supportedExtensions,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)local_368);
  vki = &local_1e8.vki;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_368,&vki->super_InstanceInterface,
             local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             local_3d8.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_3d8.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  local_3f8.m_data.deleter.m_instance = local_358;
  local_3f8.m_data.deleter.m_allocator = pVStack_350;
  local_3f8.m_data.object.m_internal = (deUint64)local_368;
  local_3f8.m_data.deleter.m_instanceIface = (InstanceInterface *)aStack_360;
  local_368 = (undefined1  [8])0x0;
  aStack_360.m_align = 0;
  local_358 = (VkInstance)0x0;
  pVStack_350 = (VkAllocationCallbacks *)0x0;
  local_434 = wsiType;
  local_428 = __return_storage_ptr__;
  local_420 = log;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_368);
  ::vk::enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &local_410,&vki->super_InstanceInterface,
             local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object);
  uVar5 = 0;
  while (uVar5 < (ulong)((long)local_410._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_410._M_impl.super__Vector_impl_data._M_start >> 3)) {
    physicalDevice = local_410._M_impl.super__Vector_impl_data._M_start[uVar5];
    local_430 = uVar5;
    dVar2 = getNumQueueFamilies(&vki->super_InstanceInterface,physicalDevice);
    local_418 = (ulong)dVar2;
    for (uVar5 = 0; local_418 != uVar5; uVar5 = uVar5 + 1) {
      VVar3 = ::vk::wsi::getPhysicalDeviceSurfaceSupport
                        (&vki->super_InstanceInterface,physicalDevice,(deUint32)uVar5,
                         (VkSurfaceKHR)local_3f8.m_data.object.m_internal);
      local_368 = (undefined1  [8])local_420;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)aStack_360.m_data);
      std::operator<<((ostream *)aStack_360.m_data,"Device ");
      std::ostream::_M_insert<unsigned_long>((ulong)&aStack_360);
      std::operator<<((ostream *)aStack_360.m_data,", queue family ");
      std::ostream::_M_insert<unsigned_long>((ulong)&aStack_360);
      std::operator<<((ostream *)aStack_360.m_data,": ");
      pcVar6 = "NOT ";
      if (VVar3 != 0) {
        pcVar6 = "";
      }
      std::operator<<((ostream *)aStack_360.m_data,pcVar6);
      std::operator<<((ostream *)aStack_360.m_data,"supported");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_368,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aStack_360.m_data);
      if ((local_434 == TYPE_ANDROID) && (VVar3 == 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_368,"Surface must be supported by all devices and queue families"
                   ,&local_435);
        tcu::ResultCollector::fail((ResultCollector *)local_3b8,(string *)local_368);
        std::__cxx11::string::~string((string *)local_368);
      }
    }
    uVar5 = local_430 + 1;
  }
  qVar4 = tcu::ResultCollector::getResult((ResultCollector *)local_3b8);
  std::__cxx11::string::string((string *)local_368,(string *)(local_3b8 + 0x30));
  pTVar1 = local_428;
  local_428->m_code = qVar4;
  std::__cxx11::string::string((string *)&local_428->m_description,(string *)local_368);
  std::__cxx11::string::~string((string *)local_368);
  std::_Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
  ~_Vector_base(&local_410);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase(&local_3f8);
  NativeObjects::~NativeObjects(&local_3d8);
  InstanceHelper::~InstanceHelper(&local_1e8);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_3b8);
  return pTVar1;
}

Assistant:

tcu::TestStatus querySurfaceSupportTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log						= context.getTestContext().getLog();
	tcu::ResultCollector			results					(log);

	const InstanceHelper			instHelper				(context, wsiType);
	const NativeObjects				native					(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>		surface					(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const vector<VkPhysicalDevice>	physicalDevices			= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);

	// On Android surface must be supported by all devices and queue families
	const bool						expectSupportedOnAll	= wsiType == TYPE_ANDROID;

	for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
	{
		const VkPhysicalDevice		physicalDevice		= physicalDevices[deviceNdx];
		const deUint32				numQueueFamilies	= getNumQueueFamilies(instHelper.vki, physicalDevice);

		for (deUint32 queueFamilyNdx = 0; queueFamilyNdx < numQueueFamilies; ++queueFamilyNdx)
		{
			const VkBool32	isSupported		= getPhysicalDeviceSurfaceSupport(instHelper.vki, physicalDevice, queueFamilyNdx, *surface);

			log << TestLog::Message << "Device " << deviceNdx << ", queue family " << queueFamilyNdx << ": "
									<< (isSupported == VK_FALSE ? "NOT " : "") << "supported"
				<< TestLog::EndMessage;

			if (expectSupportedOnAll && !isSupported)
				results.fail("Surface must be supported by all devices and queue families");
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}